

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.capnp.c++
# Opt level: O1

DispatchCallResult __thiscall
capnproto_test::capnp::test::TestPipeline::Server::dispatchCallInternal
          (Server *this,uint16_t methodId,CallContext<capnp::AnyPointer,_capnp::AnyPointer> context)

{
  long lVar1;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined6 in_register_00000032;
  DispatchCallResult DVar3;
  undefined8 uVar2;
  
  lVar1 = *(long *)CONCAT62(in_register_00000032,methodId);
  switch((ulong)context.hook & 0xffffffff) {
  case 0:
    (**(code **)(lVar1 + 8))(this);
    uVar2 = extraout_RDX;
    break;
  case 1:
    (**(code **)(lVar1 + 0x10))(this);
    uVar2 = extraout_RDX_02;
    break;
  case 2:
    (**(code **)(lVar1 + 0x18))(this);
    uVar2 = extraout_RDX_00;
    break;
  case 3:
    (**(code **)(lVar1 + 0x20))(this);
    uVar2 = extraout_RDX_01;
    break;
  default:
    DVar3 = ::capnp::Capability::Server::internalUnimplemented
                      ((Server *)this,
                       (char *)((long)CONCAT62(in_register_00000032,methodId) +
                               *(long *)(lVar1 + -0x18)),0x2ee5ae,0x4cd0);
    uVar2 = DVar3._8_8_;
    goto LAB_0021819a;
  }
  *(undefined2 *)&this->field_0x8 = 0;
LAB_0021819a:
  DVar3.isStreaming = (bool)(char)uVar2;
  DVar3.allowCancellation = (bool)(char)((ulong)uVar2 >> 8);
  DVar3._10_6_ = (int6)((ulong)uVar2 >> 0x10);
  DVar3.promise.super_PromiseBase.node.ptr = (PromiseBase)(PromiseBase)this;
  return DVar3;
}

Assistant:

::capnp::Capability::Server::DispatchCallResult TestPipeline::Server::dispatchCallInternal(
    uint16_t methodId,
    ::capnp::CallContext< ::capnp::AnyPointer, ::capnp::AnyPointer> context) {
  switch (methodId) {
    case 0:
      return {
        getCap(::capnp::Capability::Server::internalGetTypedContext<
             ::capnproto_test::capnp::test::TestPipeline::GetCapParams,  ::capnproto_test::capnp::test::TestPipeline::GetCapResults>(context)),
        false,
        false
      };
    case 1:
      return {
        testPointers(::capnp::Capability::Server::internalGetTypedContext<
             ::capnproto_test::capnp::test::TestPipeline::TestPointersParams,  ::capnproto_test::capnp::test::TestPipeline::TestPointersResults>(context)),
        false,
        false
      };
    case 2:
      return {
        getAnyCap(::capnp::Capability::Server::internalGetTypedContext<
             ::capnproto_test::capnp::test::TestPipeline::GetAnyCapParams,  ::capnproto_test::capnp::test::TestPipeline::GetAnyCapResults>(context)),
        false,
        false
      };
    case 3:
      return {
        getCapPipelineOnly(::capnp::Capability::Server::internalGetTypedContext<
             ::capnproto_test::capnp::test::TestPipeline::GetCapPipelineOnlyParams,  ::capnproto_test::capnp::test::TestPipeline::GetCapPipelineOnlyResults>(context)),
        false,
        false
      };
    default:
      (void)context;
      return ::capnp::Capability::Server::internalUnimplemented(
          "capnp/test.capnp:TestPipeline",
          0xa5a404caa61d4cd0ull, methodId);
  }
}